

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void envydis(disisa *isa,FILE *out,uint8_t *code,uint32_t start,int num,int vartype,int ptype,
            int quiet,label *labels,int labelsnum)

{
  label *plVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char **ppcVar9;
  bool bVar10;
  int iVar11;
  ulong *puVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  expr *expr;
  ulong *puVar19;
  char *__format;
  ulong uVar20;
  uint uVar21;
  size_t __nmemb;
  ulong uVar22;
  byte *pbVar23;
  byte bVar24;
  uint uVar25;
  int iVar26;
  bool bVar27;
  ull a [2];
  ull m [2];
  ull local_e8;
  ulong uStack_e0;
  ull local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong local_c0;
  disctx local_b8;
  
  uVar22 = (ulong)start;
  local_b8.atomsnum = 0;
  local_b8.atomsmax = 0;
  local_b8._120_8_ = 0;
  local_b8.labelsnum = 0;
  local_b8.labelsmax = 0;
  local_b8.atoms = (expr **)0x0;
  local_b8.line = (line *)0x0;
  local_b8.labels = (label *)0x0;
  local_b8.oplen = 0;
  local_b8.pos = 0;
  local_b8.reverse = 0;
  local_b8._76_4_ = 0;
  local_b8.codebase = 0;
  local_b8.codesz = 0;
  local_b8.vartype = 0;
  local_b8.ptype = 0;
  local_b8.marks = (int *)0x0;
  local_b8.names = (char **)0x0;
  local_b8.code32 = (uint32_t *)0x0;
  local_b8.code64 = (uint64_t *)0x0;
  local_b8.cur_global_label = (char *)0x0;
  __nmemb = (size_t)((isa->posunit + num + -1) / isa->posunit);
  local_b8.code8 = code;
  local_b8.marks = (int *)calloc(__nmemb,4);
  local_b8.names = (char **)calloc(__nmemb,8);
  local_c0 = uVar22;
  local_b8.codesz = num;
  local_b8.codebase = start;
  local_b8.ptype = ptype;
  local_b8.vartype = vartype;
  local_b8.isa = isa;
  local_b8.labels = labels;
  local_b8.labelsnum = labelsnum;
  local_c8 = (ulong)(uint)num;
  if (labels == (label *)0x0) {
    if (num < 1) goto LAB_0016c38a;
    iVar26 = 0;
    do {
      local_e8 = 0;
      uStack_e0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      iVar14 = num;
      if (num < iVar26) {
        iVar14 = iVar26;
      }
      lVar16 = -0x80;
      uVar15 = 0;
      do {
        if ((uint)(iVar14 - iVar26) == uVar15) break;
        puVar12 = (ulong *)((long)&local_e8 + (ulong)((uint)uVar15 & 0xfffffff8));
        *puVar12 = *puVar12 | (ulong)code[uVar15 + (long)iVar26] << ((char)lVar16 + 0x80U & 0x38);
        uVar15 = uVar15 + 1;
        lVar16 = lVar16 + 8;
      } while (lVar16 != 0);
      local_b8._64_8_ = (ulong)(iVar26 / isa->posunit + start) << 0x20;
      atomtab(&local_b8,&local_e8,&local_d8,isa->troot,0);
      iVar26 = iVar26 + local_b8.oplen + (uint)(local_b8.oplen == 0);
    } while (iVar26 < num);
  }
  else {
    if (0 < labelsnum) {
      uVar15 = 0;
      do {
        uVar8 = labels[uVar15].val;
        uVar25 = (uint)uVar8;
        if ((start <= uVar25) && (uVar25 < (uint)num / (uint)isa->posunit + start)) {
          local_b8.marks[uVar25 - start] = local_b8.marks[uVar25 - start] | labels[uVar15].type;
        }
        plVar1 = labels + uVar15;
        if (((start <= uVar8) && (uVar8 < start + num)) && (plVar1->name != (char *)0x0)) {
          local_b8.names[uVar8 - start] = plVar1->name;
        }
        uVar6 = plVar1->size;
        if (uVar6 != 0) {
          uVar13 = 0;
          do {
            uVar21 = uVar25 + uVar13;
            if ((start <= uVar21) && (uVar21 < (uint)num / (uint)isa->posunit + start)) {
              local_b8.marks[uVar21 - start] = local_b8.marks[uVar21 - start] | plVar1->type;
              uVar6 = plVar1->size;
            }
            uVar13 = uVar13 + 4;
          } while (uVar13 < uVar6);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != (uint)labelsnum);
    }
    do {
      iVar26 = (int)local_c8;
      if (iVar26 < 1) goto LAB_0016c38a;
      bVar2 = true;
      iVar14 = 0;
      uVar25 = 0;
      do {
        if (uVar25 == 0) {
          iVar5 = iVar14 / isa->posunit;
          uVar25 = local_b8.marks[iVar5];
          if ((char)((uVar25 & 8) >> 3) == '\0' && (uVar25 & 3) != 0) {
            local_b8.marks[iVar5] = uVar25 | 8;
            bVar2 = false;
            goto LAB_0016b849;
          }
          iVar14 = iVar14 + 1;
          uVar25 = 0;
        }
        else {
LAB_0016b849:
          local_e8 = 0;
          uStack_e0 = 0;
          local_d8 = 0;
          uStack_d0 = 0;
          iVar5 = iVar26;
          if (iVar26 < iVar14) {
            iVar5 = iVar14;
          }
          lVar16 = -0x80;
          uVar15 = 0;
          do {
            if ((uint)(iVar5 - iVar14) == uVar15) break;
            puVar12 = (ulong *)((long)&local_e8 + (ulong)((uint)uVar15 & 0xfffffff8));
            *puVar12 = *puVar12 |
                       (ulong)code[uVar15 + (long)iVar14] << ((char)lVar16 + 0x80U & 0x38);
            uVar15 = uVar15 + 1;
            lVar16 = lVar16 + 8;
          } while (lVar16 != 0);
          uVar25 = 0;
          local_b8._64_8_ = (ulong)(iVar14 / isa->posunit + start) << 0x20;
          local_b8._120_8_ = (ulong)(uint)local_b8._124_4_ << 0x20;
          atomtab(&local_b8,&local_e8,&local_d8,isa->troot,0);
          if ((local_b8.oplen != 0) && (local_b8.endmark == 0)) {
            uVar25 = (local_b8.marks[iVar14 / isa->posunit] & 4U) >> 2 ^ 1;
            iVar5 = 0;
            if ((local_b8.marks[iVar14 / isa->posunit] & 4U) == 0) {
              iVar5 = local_b8.oplen;
            }
            iVar14 = iVar14 + iVar5;
          }
        }
      } while (iVar14 < iVar26);
    } while (!bVar2);
  }
  if (0 < (int)local_c8) {
    uVar8 = local_c8 & 0xffffffff;
    iVar26 = 0;
    bVar3 = false;
    uVar20 = 0;
    bVar2 = false;
    uVar15 = local_c8;
LAB_0016ba31:
    iVar5 = iVar26 / isa->posunit;
    iVar14 = (int)uVar15;
    if (iVar26 % isa->posunit == 0) {
      uVar25 = local_b8.marks[iVar5];
      if (local_b8.names[iVar5] == (char *)0x0) {
        if ((uVar25 & 0x30) != 0) {
          if ((int)uVar20 != 0) {
            if (bVar3) {
              pcVar18 = "%s[%x bytes skipped]\n";
              pcVar17 = cunk;
            }
            else {
              pcVar18 = "%s[%x zero bytes skipped]\n";
              pcVar17 = cnorm;
            }
            bVar3 = false;
            fprintf((FILE *)out,pcVar18,pcVar17,uVar20);
          }
          goto LAB_0016c234;
        }
        goto LAB_0016ba48;
      }
      if ((int)uVar20 != 0) {
        pcVar17 = "%s[%x bytes skipped]\n";
        if (!bVar3) {
          pcVar17 = "%s[%x zero bytes skipped]\n";
        }
        ppcVar9 = &cunk;
        if (!bVar3) {
          ppcVar9 = &cnorm;
        }
        bVar3 = false;
        fprintf((FILE *)out,pcVar17,*ppcVar9,uVar20);
      }
      if ((uVar25 & 0x30) == 0) {
        if ((uVar25 & 2) == 0) {
          pcVar17 = local_b8.names[iVar26 / isa->posunit];
          pcVar18 = cbtarg;
          if ((uVar25 & 1) == 0) {
            pcVar18 = cnorm;
          }
          __format = "%s%s:\n";
        }
        else {
          pcVar17 = local_b8.names[iVar26 / isa->posunit];
          __format = "\n%s%s:\n";
          pcVar18 = cctarg;
        }
        fprintf((FILE *)out,__format,pcVar18,pcVar17);
        uVar20 = 0;
        goto LAB_0016ba48;
      }
      fprintf((FILE *)out,"%s%s:\n",cnorm,local_b8.names[iVar26 / isa->posunit]);
LAB_0016c234:
      fprintf((FILE *)out,"%s%08x:%s",cnum);
      if ((uVar25 & 0x10) == 0) {
        fprintf((FILE *)out," %s\"",cmem);
        pbVar23 = code + iVar26;
        do {
          iVar26 = iVar26 + 1;
          bVar24 = *pbVar23;
          uVar25 = (uint)bVar24;
          if (bVar24 < 0x22) {
            if (bVar24 == 10) {
              pcVar17 = "\\n";
              goto LAB_0016c2de;
            }
            if (uVar25 == 0) goto LAB_0016c364;
LAB_0016c2ec:
            fputc(uVar25,(FILE *)out);
          }
          else {
            if (uVar25 == 0x22) {
              pcVar17 = "\\\"";
            }
            else {
              if (uVar25 != 0x5c) goto LAB_0016c2ec;
              pcVar17 = "\\\\";
            }
LAB_0016c2de:
            fwrite(pcVar17,2,1,(FILE *)out);
          }
          pbVar23 = pbVar23 + 1;
        } while( true );
      }
      if (iVar14 < iVar26) {
        iVar14 = iVar26;
      }
      pbVar23 = code + iVar26;
      lVar16 = 0;
      uVar25 = 0;
      do {
        if ((ulong)(uint)(iVar14 - iVar26) << 3 == lVar16) break;
        uVar25 = uVar25 | (uint)*pbVar23 << ((byte)lVar16 & 0x1f);
        pbVar23 = pbVar23 + 1;
        lVar16 = lVar16 + 8;
      } while (lVar16 != 0x20);
      fprintf((FILE *)out," %s%08x\n",cmem,(ulong)uVar25);
      iVar26 = (int)(4 / (long)isa->posunit) + iVar26;
      goto LAB_0016c17b;
    }
    uVar25 = 0;
LAB_0016ba48:
    bVar27 = true;
    if (bVar2) {
LAB_0016ba5b:
      bVar2 = bVar27;
      if ((int)uVar20 != 0) {
        pcVar17 = "%s[%x bytes skipped]\n";
        if (!bVar3) {
          pcVar17 = "%s[%x zero bytes skipped]\n";
        }
        ppcVar9 = &cunk;
        if (!bVar3) {
          ppcVar9 = &cnorm;
        }
        bVar3 = false;
        fprintf((FILE *)out,pcVar17,*ppcVar9,uVar20);
      }
      local_e8 = 0;
      uStack_e0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      if (iVar14 < iVar26) {
        iVar14 = iVar26;
      }
      lVar16 = -0x80;
      uVar15 = 0;
      do {
        if ((uint)(iVar14 - iVar26) == uVar15) break;
        puVar12 = (ulong *)((long)&local_e8 + (ulong)((uint)uVar15 & 0xfffffff8));
        *puVar12 = *puVar12 | (ulong)code[uVar15 + (long)iVar26] << ((char)lVar16 + 0x80U & 0x38);
        uVar15 = uVar15 + 1;
        lVar16 = lVar16 + 8;
      } while (lVar16 != 0);
      iVar14 = (int)uVar22;
      local_b8._64_8_ = (ulong)(uint)(iVar26 / isa->posunit + iVar14) << 0x20;
      local_b8._112_8_ = (ulong)(uint)local_b8.atomsmax << 0x20;
      local_b8._120_8_ = (ulong)(uint)local_b8._124_4_ << 0x20;
      atomtab(&local_b8,&local_e8,&local_d8,isa->troot,0);
      if ((uVar25 & 4) != 0 || local_b8.endmark != 0) {
        bVar2 = false;
      }
      if (((uVar25 & 2) != 0) && (local_b8.names[iVar26 / isa->posunit] == (char *)0x0)) {
        fputc(10,(FILE *)out);
      }
      ppcVar9 = &cbtarg;
      switch(uVar25 & 3) {
      case 0:
        if (quiet != 0) goto LAB_0016bd26;
        fprintf((FILE *)out,"%s%08x:%s",cnorm,(ulong)(uint)(iVar26 / isa->posunit + iVar14));
        goto LAB_0016bd4f;
      case 2:
        ppcVar9 = &cctarg;
        break;
      case 3:
        ppcVar9 = &cbctarg;
      }
      fprintf((FILE *)out,"%s%08x:%s",*ppcVar9,(ulong)(uint)(iVar26 / isa->posunit + iVar14));
      if (quiet == 0) {
LAB_0016bd4f:
        if (0 < isa->maxoplen) {
          iVar14 = 0;
          do {
            fputc(0x20,(FILE *)out);
            iVar5 = isa->opunit;
            if (0 < (long)iVar5) {
              uVar22 = (long)iVar5 + 1;
              do {
                if ((uVar22 + (long)iVar14 == 2) ||
                   ((long)(uVar22 + (long)iVar14 + -2) < (long)local_b8.oplen)) {
                  if ((long)(uVar22 + (long)(iVar26 + iVar14) + -2) < (long)uVar8) {
                    fprintf((FILE *)out,"%s%02x",cnorm,
                            (ulong)code[uVar22 + (long)(iVar26 + iVar14) + -2]);
                  }
                  else {
                    fprintf((FILE *)out,"%s??",cunk);
                  }
                }
                else {
                  fwrite("  ",2,1,(FILE *)out);
                }
                uVar22 = uVar22 - 1;
              } while (1 < uVar22);
              iVar5 = isa->opunit;
              uVar22 = local_c0;
            }
            iVar14 = iVar14 + iVar5;
          } while (iVar14 < isa->maxoplen);
        }
        fwrite("  ",2,1,(FILE *)out);
        if ((uVar25 & 2) == 0) {
          fputc(0x20,(FILE *)out);
        }
        else {
          fprintf((FILE *)out,"%sC",cctarg);
        }
        if ((uVar25 & 1) == 0) {
          fputc(0x20,(FILE *)out);
          bVar24 = 0;
        }
        else {
          bVar24 = 0;
          fprintf((FILE *)out,"%sB",cbtarg);
        }
      }
      else {
LAB_0016bd26:
        bVar24 = 1;
        if ((quiet == 1) && (uVar25 != 0)) {
          fputc(10,(FILE *)out);
        }
      }
      if (0 < local_b8.atomsnum) {
        lVar16 = 0;
        bVar27 = false;
        do {
          expr = local_b8.atoms[lVar16];
          if (((!(bool)(bVar24 & lVar16 == 0)) && (expr->type != EXPR_SEEND)) && (!bVar27)) {
            fputc(0x20,(FILE *)out);
            expr = local_b8.atoms[lVar16];
          }
          printexpr(out,expr,0);
          bVar27 = local_b8.atoms[lVar16]->type == EXPR_SESTART;
          lVar16 = lVar16 + 1;
        } while (lVar16 < local_b8.atomsnum);
      }
      uVar15 = local_c8;
      iVar14 = local_b8.oplen;
      if (local_b8.oplen == 0) {
        fprintf((FILE *)out," %s[unknown op length]%s",cunk,cnorm);
        iVar14 = 1;
        uVar15 = local_c8;
      }
      else {
        if (local_b8.oplen < 0x10) {
          iVar7 = local_b8.oplen * 8;
          iVar5 = local_b8.oplen;
          do {
            iVar11 = iVar5 + 7;
            if (-1 < iVar5) {
              iVar11 = iVar5;
            }
            (&local_e8)[iVar11 >> 3] = (&local_e8)[iVar11 >> 3] & ~(0xffL << ((byte)iVar7 & 0x38));
            iVar5 = iVar5 + 1;
            iVar7 = iVar7 + 8;
          } while (iVar5 != 0x10);
        }
        bVar27 = false;
        puVar12 = &local_e8;
        puVar19 = &local_d8;
        bVar4 = true;
        do {
          bVar10 = bVar4;
          *puVar12 = *puVar12 & ~*puVar19;
          if (*puVar12 != 0) {
            bVar27 = true;
          }
          puVar12 = &uStack_e0;
          puVar19 = &uStack_d0;
          bVar4 = false;
        } while (bVar10);
        if (bVar27) {
          iVar14 = 0;
          fprintf((FILE *)out," %s[unknown:",cunk);
          do {
            fputc(0x20,(FILE *)out);
            uVar25 = isa->opunit;
            if (0 < (int)uVar25) {
              iVar5 = (uVar25 + iVar14 + -1) * 8;
              do {
                uVar6 = uVar25 - 1;
                if ((int)(uVar6 + iVar26 + iVar14) < (int)uVar15) {
                  iVar7 = iVar14 + 7 + uVar6;
                  if (-1 < (int)(iVar14 + uVar6)) {
                    iVar7 = iVar14 + uVar6;
                  }
                  fprintf((FILE *)out,"%02llx",
                          (&local_e8)[iVar7 >> 3] >> ((byte)iVar5 & 0x38) & 0xff);
                }
                else {
                  fwrite("??",2,1,(FILE *)out);
                }
                iVar5 = iVar5 + -8;
                bVar27 = 1 < uVar25;
                uVar25 = uVar6;
              } while (bVar27);
              uVar25 = isa->opunit;
              uVar22 = local_c0;
            }
            iVar14 = iVar14 + uVar25;
          } while ((iVar14 == 0) || (iVar14 < local_b8.oplen));
          fputc(0x5d,(FILE *)out);
          iVar14 = local_b8.oplen;
        }
        if ((int)uVar15 < iVar14 + iVar26) {
          fprintf((FILE *)out," %s[incomplete]%s",cunk,cnorm);
          iVar14 = local_b8.oplen;
        }
      }
      iVar26 = iVar14 + iVar26;
      fprintf((FILE *)out,"%s\n",cnorm);
      goto LAB_0016c17b;
    }
    uVar6 = uVar25 & 7;
    bVar27 = uVar6 != 0;
    if ((labels == (label *)0x0) || (uVar6 != 0)) goto LAB_0016ba5b;
    if (code[iVar26] != '\0') {
      bVar3 = true;
    }
    iVar26 = iVar26 + 1;
    uVar20 = (ulong)((int)uVar20 + 1);
    bVar2 = false;
    goto LAB_0016c180;
  }
LAB_0016c38a:
  free(local_b8.marks);
  return;
LAB_0016c364:
  fwrite("\"\n",2,1,(FILE *)out);
LAB_0016c17b:
  uVar20 = 0;
LAB_0016c180:
  if ((int)uVar15 <= iVar26) goto LAB_0016c38a;
  goto LAB_0016ba31;
}

Assistant:

void envydis (const struct disisa *isa, FILE *out, uint8_t *code, uint32_t start, int num, int vartype, int ptype, int quiet, struct label *labels, int labelsnum)
{
	struct disctx c = { 0 };
	struct disctx *ctx = &c;
	int cur = 0, i, j;
	ctx->code8 = code;
	ctx->marks = calloc((num + isa->posunit - 1) / isa->posunit, sizeof *ctx->marks);
	ctx->names = calloc((num + isa->posunit - 1) / isa->posunit, sizeof *ctx->names);
	ctx->codebase = start;
	ctx->codesz = num;
	ctx->vartype = vartype;
	ctx->ptype = ptype;
	ctx->isa = isa;
	ctx->labels = labels;
	ctx->labelsnum = labelsnum;
	if (labels) {
		for (i = 0; i < labelsnum; i++) {
			mark(ctx, labels[i].val, labels[i].type);
			if (labels[i].val >= ctx->codebase && labels[i].val < ctx->codebase + ctx->codesz) {
				if (labels[i].name)
					ctx->names[labels[i].val - ctx->codebase] = labels[i].name;
			}
			if (labels[i].size) {
				for (j = 0; j < labels[i].size; j+=4)
					mark(ctx, labels[i].val + j, labels[i].type);
			}
		}
		int done;
		do {
			done = 1;
			cur = 0;
			int active = 0;
			while (cur < num) {
				if (!active && (ctx->marks[cur / isa->posunit] & 3) && !(ctx->marks[cur / isa->posunit] & 8)) {
					done = 0;
					active = 1;
					ctx->marks[cur / isa->posunit] |= 8;
				}
				if (active) {
					ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
					for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
						a[i/8] |= (ull)code[cur + i] << (i&7)*8;
					}
					ctx->oplen = 0;
					ctx->pos = cur / isa->posunit + start;
					ctx->endmark = 0;
					atomtab (ctx, a, m, isa->troot, 0);
					if (ctx->oplen && !ctx->endmark && !(ctx->marks[cur / isa->posunit] & 4))
						cur += ctx->oplen;
					else
						active = 0;
				} else {
					cur++;
				}
			}
		} while (!done);
	} else {
		while (cur < num) {
			ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
			for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
				a[i/8] |= (ull)code[cur + i] << (i&7)*8;
			}
			ctx->oplen = 0;
			ctx->pos = cur / isa->posunit + start;
			atomtab (ctx, a, m, isa->troot, 0);
			if (ctx->oplen)
				cur += ctx->oplen;
			else
				cur++;
		}
	}
	cur = 0;
	int active = 0;
	int skip = 0, nonzero = 0;
	while (cur < num) {
		int mark = (cur % isa->posunit ? 0 : ctx->marks[cur / isa->posunit]);
		if (!(cur % isa->posunit) && ctx->names[cur / isa->posunit]) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
				skip = 0;
				nonzero = 0;
			}
			if (mark & 0x30)
				fprintf (out, "%s%s:\n", cnorm, ctx->names[cur / isa->posunit]);
			else if (mark & 2)
				fprintf (out, "\n%s%s:\n", cctarg, ctx->names[cur / isa->posunit]);
			else if (mark & 1)
				fprintf (out, "%s%s:\n", cbtarg, ctx->names[cur / isa->posunit]);
			else
				fprintf (out, "%s%s:\n", cnorm, ctx->names[cur / isa->posunit]);
		}
		if (mark & 0x30) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
				skip = 0;
				nonzero = 0;
			}
			fprintf (out, "%s%08x:%s", cnum, cur / isa->posunit + start, cnorm);
			if (mark & 0x10) {
				uint32_t val = 0;
				for (i = 0; i < 4 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%08x\n", cmem, val);
				cur += 4 / isa->posunit;
			} else {
				fprintf (out, " %s\"", cmem);
				while (code[cur]) {
					switch (code[cur]) {
						case '\n':
							fprintf (out, "\\n");
							break;
						case '\\':
							fprintf (out, "\\\\");
							break;
						case '\"':
							fprintf (out, "\\\"");
							break;
						default:
							fprintf (out, "%c", code[cur]);
							break;
					}
					cur++;
				}
				cur++;
				fprintf (out, "\"\n");
			}
			continue;
		}
		if (!active && mark & 7)
			active = 1;
		if (!active && labels) {
			if (code[cur])
				nonzero = 1;
			cur++;
			skip++;
			continue;
		}
		if (skip) {
			if (nonzero)
				fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
			else
				fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
			skip = 0;
			nonzero = 0;
		}
		ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
		for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
			a[i/8] |= (ull)code[cur + i] << (i&7)*8;
		}
		ctx->oplen = 0;
		ctx->pos = cur / isa->posunit + start;
		ctx->atomsnum = 0;
		ctx->endmark = 0;
		atomtab (ctx, a, m, isa->troot, 0);

		if (ctx->endmark || mark & 4)
			active = 0;

		if (mark & 2 && !ctx->names[cur / isa->posunit])
			fprintf (out, "\n");
		switch (mark & 3) {
			case 0:
				if (!quiet)
					fprintf (out, "%s%08x:%s", cnorm, cur / isa->posunit + start, cnorm);
				break;
			case 1:
				fprintf (out, "%s%08x:%s", cbtarg, cur / isa->posunit + start, cnorm);
				break;
			case 2:
				fprintf (out, "%s%08x:%s", cctarg, cur / isa->posunit + start, cnorm);
				break;
			case 3:
				fprintf (out, "%s%08x:%s", cbctarg, cur / isa->posunit + start, cnorm);
				break;
		}

		if (!quiet) {
			for (i = 0; i < isa->maxoplen; i += isa->opunit) {
				fprintf (out, " ");
				for (j = isa->opunit - 1; j >= 0; j--)
					if (i+j && i+j >= ctx->oplen)
						fprintf (out, "  ");
					else if (cur+i+j >= num)
						fprintf (out, "%s??", cunk);
					else
						fprintf (out, "%s%02x", cnorm, code[cur + i + j]);
			}
			fprintf (out, "  ");

			if (mark & 2)
				fprintf (out, "%sC", cctarg);
			else
				fprintf (out, " ");
			if (mark & 1)
				fprintf (out, "%sB", cbtarg);
			else
				fprintf (out, " ");
		} else if (quiet == 1) {
			if (mark)
				fprintf (out, "\n");
		}

		int noblank = 0;

		for (i = 0; i < ctx->atomsnum; i++) {
			if (ctx->atoms[i]->type == EXPR_SEEND)
				noblank = 1;
			if ((i || !quiet) && !noblank)
				fprintf (out, " ");
			printexpr(out, ctx->atoms[i], 0);
			noblank = (ctx->atoms[i]->type == EXPR_SESTART);
		}

		if (ctx->oplen) {
			int fl = 0;
			for (i = ctx->oplen; i < MAXOPLEN * 8; i++)
				a[i/8] &= ~(0xffull << (i & 7) * 8);
			for (i = 0; i < MAXOPLEN; i++) {
				a[i] &= ~m[i];
				if (a[i])
					fl = 1;
			}
			if (fl) {
				fprintf (out, " %s[unknown:", cunk);
				for (i = 0; i < ctx->oplen || i == 0; i += isa->opunit) {
					fprintf (out, " ");
					for (j = isa->opunit - 1; j >= 0; j--)
						if (cur+i+j >= num)
							fprintf (out, "??");
						else
							fprintf (out, "%02llx", (a[(i+j)/8] >> ((i + j)&7) * 8) & 0xff);
				}
				fprintf (out, "]");
			}
			if (cur + ctx->oplen > num) {
				fprintf (out, " %s[incomplete]%s", cunk, cnorm);
			}
			cur += ctx->oplen;
		} else {
			fprintf (out, " %s[unknown op length]%s", cunk, cnorm);
			cur++;
		}
		fprintf (out, "%s\n", cnorm);
	}
	free(ctx->marks);
}